

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::debug_logger<true>::debug_logger(debug_logger<true> *this,string_view name)

{
  FILE *pFVar1;
  ulong __n;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  char buffer [512];
  pthread_t local_378;
  buffer<char> local_370;
  ulong uStack_350;
  ulong uStack_348;
  char *local_340;
  char local_338 [256];
  char *local_238;
  size_t local_230;
  undefined8 local_228;
  char local_218 [512];
  
  this->ofs = (FILE *)0x0;
  local_218[0x1c0] = '\0';
  local_218[0x1c1] = '\0';
  local_218[0x1c2] = '\0';
  local_218[0x1c3] = '\0';
  local_218[0x1c4] = '\0';
  local_218[0x1c5] = '\0';
  local_218[0x1c6] = '\0';
  local_218[0x1c7] = '\0';
  local_218[0x1c8] = '\0';
  local_218[0x1c9] = '\0';
  local_218[0x1ca] = '\0';
  local_218[0x1cb] = '\0';
  local_218[0x1cc] = '\0';
  local_218[0x1cd] = '\0';
  local_218[0x1ce] = '\0';
  local_218[0x1cf] = '\0';
  local_218[0x1d0] = '\0';
  local_218[0x1d1] = '\0';
  local_218[0x1d2] = '\0';
  local_218[0x1d3] = '\0';
  local_218[0x1d4] = '\0';
  local_218[0x1d5] = '\0';
  local_218[0x1d6] = '\0';
  local_218[0x1d7] = '\0';
  local_218[0x1d8] = '\0';
  local_218[0x1d9] = '\0';
  local_218[0x1da] = '\0';
  local_218[0x1db] = '\0';
  local_218[0x1dc] = '\0';
  local_218[0x1dd] = '\0';
  local_218[0x1de] = '\0';
  local_218[0x1df] = '\0';
  local_218[0x1e0] = '\0';
  local_218[0x1e1] = '\0';
  local_218[0x1e2] = '\0';
  local_218[0x1e3] = '\0';
  local_218[0x1e4] = '\0';
  local_218[0x1e5] = '\0';
  local_218[0x1e6] = '\0';
  local_218[0x1e7] = '\0';
  local_218[0x1e8] = '\0';
  local_218[0x1e9] = '\0';
  local_218[0x1ea] = '\0';
  local_218[0x1eb] = '\0';
  local_218[0x1ec] = '\0';
  local_218[0x1ed] = '\0';
  local_218[0x1ee] = '\0';
  local_218[0x1ef] = '\0';
  local_218[0x1f0] = '\0';
  local_218[0x1f1] = '\0';
  local_218[0x1f2] = '\0';
  local_218[499] = '\0';
  local_218[500] = '\0';
  local_218[0x1f5] = '\0';
  local_218[0x1f6] = '\0';
  local_218[0x1f7] = '\0';
  local_218[0x1f8] = '\0';
  local_218[0x1f9] = '\0';
  local_218[0x1fa] = '\0';
  local_218[0x1fb] = '\0';
  local_218[0x1fc] = '\0';
  local_218[0x1fd] = '\0';
  local_218[0x1fe] = '\0';
  local_218[0x1ff] = '\0';
  local_218[0x180] = '\0';
  local_218[0x181] = '\0';
  local_218[0x182] = '\0';
  local_218[0x183] = '\0';
  local_218[0x184] = '\0';
  local_218[0x185] = '\0';
  local_218[0x186] = '\0';
  local_218[0x187] = '\0';
  local_218[0x188] = '\0';
  local_218[0x189] = '\0';
  local_218[0x18a] = '\0';
  local_218[0x18b] = '\0';
  local_218[0x18c] = '\0';
  local_218[0x18d] = '\0';
  local_218[0x18e] = '\0';
  local_218[399] = '\0';
  local_218[400] = '\0';
  local_218[0x191] = '\0';
  local_218[0x192] = '\0';
  local_218[0x193] = '\0';
  local_218[0x194] = '\0';
  local_218[0x195] = '\0';
  local_218[0x196] = '\0';
  local_218[0x197] = '\0';
  local_218[0x198] = '\0';
  local_218[0x199] = '\0';
  local_218[0x19a] = '\0';
  local_218[0x19b] = '\0';
  local_218[0x19c] = '\0';
  local_218[0x19d] = '\0';
  local_218[0x19e] = '\0';
  local_218[0x19f] = '\0';
  local_218[0x1a0] = '\0';
  local_218[0x1a1] = '\0';
  local_218[0x1a2] = '\0';
  local_218[0x1a3] = '\0';
  local_218[0x1a4] = '\0';
  local_218[0x1a5] = '\0';
  local_218[0x1a6] = '\0';
  local_218[0x1a7] = '\0';
  local_218[0x1a8] = '\0';
  local_218[0x1a9] = '\0';
  local_218[0x1aa] = '\0';
  local_218[0x1ab] = '\0';
  local_218[0x1ac] = '\0';
  local_218[0x1ad] = '\0';
  local_218[0x1ae] = '\0';
  local_218[0x1af] = '\0';
  local_218[0x1b0] = '\0';
  local_218[0x1b1] = '\0';
  local_218[0x1b2] = '\0';
  local_218[0x1b3] = '\0';
  local_218[0x1b4] = '\0';
  local_218[0x1b5] = '\0';
  local_218[0x1b6] = '\0';
  local_218[0x1b7] = '\0';
  local_218[0x1b8] = '\0';
  local_218[0x1b9] = '\0';
  local_218[0x1ba] = '\0';
  local_218[0x1bb] = '\0';
  local_218[0x1bc] = '\0';
  local_218[0x1bd] = '\0';
  local_218[0x1be] = '\0';
  local_218[0x1bf] = '\0';
  local_218[0x140] = '\0';
  local_218[0x141] = '\0';
  local_218[0x142] = '\0';
  local_218[0x143] = '\0';
  local_218[0x144] = '\0';
  local_218[0x145] = '\0';
  local_218[0x146] = '\0';
  local_218[0x147] = '\0';
  local_218[0x148] = '\0';
  local_218[0x149] = '\0';
  local_218[0x14a] = '\0';
  local_218[0x14b] = '\0';
  local_218[0x14c] = '\0';
  local_218[0x14d] = '\0';
  local_218[0x14e] = '\0';
  local_218[0x14f] = '\0';
  local_218[0x150] = '\0';
  local_218[0x151] = '\0';
  local_218[0x152] = '\0';
  local_218[0x153] = '\0';
  local_218[0x154] = '\0';
  local_218[0x155] = '\0';
  local_218[0x156] = '\0';
  local_218[0x157] = '\0';
  local_218[0x158] = '\0';
  local_218[0x159] = '\0';
  local_218[0x15a] = '\0';
  local_218[0x15b] = '\0';
  local_218[0x15c] = '\0';
  local_218[0x15d] = '\0';
  local_218[0x15e] = '\0';
  local_218[0x15f] = '\0';
  local_218[0x160] = '\0';
  local_218[0x161] = '\0';
  local_218[0x162] = '\0';
  local_218[0x163] = '\0';
  local_218[0x164] = '\0';
  local_218[0x165] = '\0';
  local_218[0x166] = '\0';
  local_218[0x167] = '\0';
  local_218[0x168] = '\0';
  local_218[0x169] = '\0';
  local_218[0x16a] = '\0';
  local_218[0x16b] = '\0';
  local_218[0x16c] = '\0';
  local_218[0x16d] = '\0';
  local_218[0x16e] = '\0';
  local_218[0x16f] = '\0';
  local_218[0x170] = '\0';
  local_218[0x171] = '\0';
  local_218[0x172] = '\0';
  local_218[0x173] = '\0';
  local_218[0x174] = '\0';
  local_218[0x175] = '\0';
  local_218[0x176] = '\0';
  local_218[0x177] = '\0';
  local_218[0x178] = '\0';
  local_218[0x179] = '\0';
  local_218[0x17a] = '\0';
  local_218[0x17b] = '\0';
  local_218[0x17c] = '\0';
  local_218[0x17d] = '\0';
  local_218[0x17e] = '\0';
  local_218[0x17f] = '\0';
  local_218[0x100] = '\0';
  local_218[0x101] = '\0';
  local_218[0x102] = '\0';
  local_218[0x103] = '\0';
  local_218[0x104] = '\0';
  local_218[0x105] = '\0';
  local_218[0x106] = '\0';
  local_218[0x107] = '\0';
  local_218[0x108] = '\0';
  local_218[0x109] = '\0';
  local_218[0x10a] = '\0';
  local_218[0x10b] = '\0';
  local_218[0x10c] = '\0';
  local_218[0x10d] = '\0';
  local_218[0x10e] = '\0';
  local_218[0x10f] = '\0';
  local_218[0x110] = '\0';
  local_218[0x111] = '\0';
  local_218[0x112] = '\0';
  local_218[0x113] = '\0';
  local_218[0x114] = '\0';
  local_218[0x115] = '\0';
  local_218[0x116] = '\0';
  local_218[0x117] = '\0';
  local_218[0x118] = '\0';
  local_218[0x119] = '\0';
  local_218[0x11a] = '\0';
  local_218[0x11b] = '\0';
  local_218[0x11c] = '\0';
  local_218[0x11d] = '\0';
  local_218[0x11e] = '\0';
  local_218[0x11f] = '\0';
  local_218[0x120] = '\0';
  local_218[0x121] = '\0';
  local_218[0x122] = '\0';
  local_218[0x123] = '\0';
  local_218[0x124] = '\0';
  local_218[0x125] = '\0';
  local_218[0x126] = '\0';
  local_218[0x127] = '\0';
  local_218[0x128] = '\0';
  local_218[0x129] = '\0';
  local_218[0x12a] = '\0';
  local_218[299] = '\0';
  local_218[300] = '\0';
  local_218[0x12d] = '\0';
  local_218[0x12e] = '\0';
  local_218[0x12f] = '\0';
  local_218[0x130] = '\0';
  local_218[0x131] = '\0';
  local_218[0x132] = '\0';
  local_218[0x133] = '\0';
  local_218[0x134] = '\0';
  local_218[0x135] = '\0';
  local_218[0x136] = '\0';
  local_218[0x137] = '\0';
  local_218[0x138] = '\0';
  local_218[0x139] = '\0';
  local_218[0x13a] = '\0';
  local_218[0x13b] = '\0';
  local_218[0x13c] = '\0';
  local_218[0x13d] = '\0';
  local_218[0x13e] = '\0';
  local_218[0x13f] = '\0';
  local_218[0xc0] = '\0';
  local_218[0xc1] = '\0';
  local_218[0xc2] = '\0';
  local_218[0xc3] = '\0';
  local_218[0xc4] = '\0';
  local_218[0xc5] = '\0';
  local_218[0xc6] = '\0';
  local_218[199] = '\0';
  local_218[200] = '\0';
  local_218[0xc9] = '\0';
  local_218[0xca] = '\0';
  local_218[0xcb] = '\0';
  local_218[0xcc] = '\0';
  local_218[0xcd] = '\0';
  local_218[0xce] = '\0';
  local_218[0xcf] = '\0';
  local_218[0xd0] = '\0';
  local_218[0xd1] = '\0';
  local_218[0xd2] = '\0';
  local_218[0xd3] = '\0';
  local_218[0xd4] = '\0';
  local_218[0xd5] = '\0';
  local_218[0xd6] = '\0';
  local_218[0xd7] = '\0';
  local_218[0xd8] = '\0';
  local_218[0xd9] = '\0';
  local_218[0xda] = '\0';
  local_218[0xdb] = '\0';
  local_218[0xdc] = '\0';
  local_218[0xdd] = '\0';
  local_218[0xde] = '\0';
  local_218[0xdf] = '\0';
  local_218[0xe0] = '\0';
  local_218[0xe1] = '\0';
  local_218[0xe2] = '\0';
  local_218[0xe3] = '\0';
  local_218[0xe4] = '\0';
  local_218[0xe5] = '\0';
  local_218[0xe6] = '\0';
  local_218[0xe7] = '\0';
  local_218[0xe8] = '\0';
  local_218[0xe9] = '\0';
  local_218[0xea] = '\0';
  local_218[0xeb] = '\0';
  local_218[0xec] = '\0';
  local_218[0xed] = '\0';
  local_218[0xee] = '\0';
  local_218[0xef] = '\0';
  local_218[0xf0] = '\0';
  local_218[0xf1] = '\0';
  local_218[0xf2] = '\0';
  local_218[0xf3] = '\0';
  local_218[0xf4] = '\0';
  local_218[0xf5] = '\0';
  local_218[0xf6] = '\0';
  local_218[0xf7] = '\0';
  local_218[0xf8] = '\0';
  local_218[0xf9] = '\0';
  local_218[0xfa] = '\0';
  local_218[0xfb] = '\0';
  local_218[0xfc] = '\0';
  local_218[0xfd] = '\0';
  local_218[0xfe] = '\0';
  local_218[0xff] = '\0';
  local_218[0x80] = '\0';
  local_218[0x81] = '\0';
  local_218[0x82] = '\0';
  local_218[0x83] = '\0';
  local_218[0x84] = '\0';
  local_218[0x85] = '\0';
  local_218[0x86] = '\0';
  local_218[0x87] = '\0';
  local_218[0x88] = '\0';
  local_218[0x89] = '\0';
  local_218[0x8a] = '\0';
  local_218[0x8b] = '\0';
  local_218[0x8c] = '\0';
  local_218[0x8d] = '\0';
  local_218[0x8e] = '\0';
  local_218[0x8f] = '\0';
  local_218[0x90] = '\0';
  local_218[0x91] = '\0';
  local_218[0x92] = '\0';
  local_218[0x93] = '\0';
  local_218[0x94] = '\0';
  local_218[0x95] = '\0';
  local_218[0x96] = '\0';
  local_218[0x97] = '\0';
  local_218[0x98] = '\0';
  local_218[0x99] = '\0';
  local_218[0x9a] = '\0';
  local_218[0x9b] = '\0';
  local_218[0x9c] = '\0';
  local_218[0x9d] = '\0';
  local_218[0x9e] = '\0';
  local_218[0x9f] = '\0';
  local_218[0xa0] = '\0';
  local_218[0xa1] = '\0';
  local_218[0xa2] = '\0';
  local_218[0xa3] = '\0';
  local_218[0xa4] = '\0';
  local_218[0xa5] = '\0';
  local_218[0xa6] = '\0';
  local_218[0xa7] = '\0';
  local_218[0xa8] = '\0';
  local_218[0xa9] = '\0';
  local_218[0xaa] = '\0';
  local_218[0xab] = '\0';
  local_218[0xac] = '\0';
  local_218[0xad] = '\0';
  local_218[0xae] = '\0';
  local_218[0xaf] = '\0';
  local_218[0xb0] = '\0';
  local_218[0xb1] = '\0';
  local_218[0xb2] = '\0';
  local_218[0xb3] = '\0';
  local_218[0xb4] = '\0';
  local_218[0xb5] = '\0';
  local_218[0xb6] = '\0';
  local_218[0xb7] = '\0';
  local_218[0xb8] = '\0';
  local_218[0xb9] = '\0';
  local_218[0xba] = '\0';
  local_218[0xbb] = '\0';
  local_218[0xbc] = '\0';
  local_218[0xbd] = '\0';
  local_218[0xbe] = '\0';
  local_218[0xbf] = '\0';
  local_218[0x40] = '\0';
  local_218[0x41] = '\0';
  local_218[0x42] = '\0';
  local_218[0x43] = '\0';
  local_218[0x44] = '\0';
  local_218[0x45] = '\0';
  local_218[0x46] = '\0';
  local_218[0x47] = '\0';
  local_218[0x48] = '\0';
  local_218[0x49] = '\0';
  local_218[0x4a] = '\0';
  local_218[0x4b] = '\0';
  local_218[0x4c] = '\0';
  local_218[0x4d] = '\0';
  local_218[0x4e] = '\0';
  local_218[0x4f] = '\0';
  local_218[0x50] = '\0';
  local_218[0x51] = '\0';
  local_218[0x52] = '\0';
  local_218[0x53] = '\0';
  local_218[0x54] = '\0';
  local_218[0x55] = '\0';
  local_218[0x56] = '\0';
  local_218[0x57] = '\0';
  local_218[0x58] = '\0';
  local_218[0x59] = '\0';
  local_218[0x5a] = '\0';
  local_218[0x5b] = '\0';
  local_218[0x5c] = '\0';
  local_218[0x5d] = '\0';
  local_218[0x5e] = '\0';
  local_218[0x5f] = '\0';
  local_218[0x60] = '\0';
  local_218[0x61] = '\0';
  local_218[0x62] = '\0';
  local_218[99] = '\0';
  local_218[100] = '\0';
  local_218[0x65] = '\0';
  local_218[0x66] = '\0';
  local_218[0x67] = '\0';
  local_218[0x68] = '\0';
  local_218[0x69] = '\0';
  local_218[0x6a] = '\0';
  local_218[0x6b] = '\0';
  local_218[0x6c] = '\0';
  local_218[0x6d] = '\0';
  local_218[0x6e] = '\0';
  local_218[0x6f] = '\0';
  local_218[0x70] = '\0';
  local_218[0x71] = '\0';
  local_218[0x72] = '\0';
  local_218[0x73] = '\0';
  local_218[0x74] = '\0';
  local_218[0x75] = '\0';
  local_218[0x76] = '\0';
  local_218[0x77] = '\0';
  local_218[0x78] = '\0';
  local_218[0x79] = '\0';
  local_218[0x7a] = '\0';
  local_218[0x7b] = '\0';
  local_218[0x7c] = '\0';
  local_218[0x7d] = '\0';
  local_218[0x7e] = '\0';
  local_218[0x7f] = '\0';
  local_218[0] = '\0';
  local_218[1] = '\0';
  local_218[2] = '\0';
  local_218[3] = '\0';
  local_218[4] = '\0';
  local_218[5] = '\0';
  local_218[6] = '\0';
  local_218[7] = '\0';
  local_218[8] = '\0';
  local_218[9] = '\0';
  local_218[10] = '\0';
  local_218[0xb] = '\0';
  local_218[0xc] = '\0';
  local_218[0xd] = '\0';
  local_218[0xe] = '\0';
  local_218[0xf] = '\0';
  local_218[0x10] = '\0';
  local_218[0x11] = '\0';
  local_218[0x12] = '\0';
  local_218[0x13] = '\0';
  local_218[0x14] = '\0';
  local_218[0x15] = '\0';
  local_218[0x16] = '\0';
  local_218[0x17] = '\0';
  local_218[0x18] = '\0';
  local_218[0x19] = '\0';
  local_218[0x1a] = '\0';
  local_218[0x1b] = '\0';
  local_218[0x1c] = '\0';
  local_218[0x1d] = '\0';
  local_218[0x1e] = '\0';
  local_218[0x1f] = '\0';
  local_218[0x20] = '\0';
  local_218[0x21] = '\0';
  local_218[0x22] = '\0';
  local_218[0x23] = '\0';
  local_218[0x24] = '\0';
  local_218[0x25] = '\0';
  local_218[0x26] = '\0';
  local_218[0x27] = '\0';
  local_218[0x28] = '\0';
  local_218[0x29] = '\0';
  local_218[0x2a] = '\0';
  local_218[0x2b] = '\0';
  local_218[0x2c] = '\0';
  local_218[0x2d] = '\0';
  local_218[0x2e] = '\0';
  local_218[0x2f] = '\0';
  local_218[0x30] = '\0';
  local_218[0x31] = '\0';
  local_218[0x32] = '\0';
  local_218[0x33] = '\0';
  local_218[0x34] = '\0';
  local_218[0x35] = '\0';
  local_218[0x36] = '\0';
  local_218[0x37] = '\0';
  local_218[0x38] = '\0';
  local_218[0x39] = '\0';
  local_218[0x3a] = '\0';
  local_218[0x3b] = '\0';
  local_218[0x3c] = '\0';
  local_218[0x3d] = '\0';
  local_218[0x3e] = '\0';
  local_218[0x3f] = '\0';
  local_378 = pthread_self();
  local_228 = std::_Hash_bytes(&local_378,8,0xc70f6907);
  local_340 = local_218;
  local_370.size_ = 0;
  local_370.capacity_ = 0x100;
  uStack_350 = 0;
  uStack_348 = 0x1ff;
  local_370._vptr_buffer = (_func_int **)&PTR_grow_0079cec8;
  format_str.size_ = 9;
  format_str.data_ = "{}-{}.log";
  args.field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_238;
  args.desc_ = 0x4d;
  local_370.ptr_ = local_338;
  local_238 = name._M_str;
  local_230 = name._M_len;
  ::fmt::v7::detail::vformat_to<char>(&local_370,format_str,args,(locale_ref)0x0);
  __n = 0;
  if (uStack_350 <= uStack_348) {
    __n = uStack_348 - uStack_350;
  }
  uStack_350 = uStack_350 + local_370.size_;
  if (local_370.size_ <= __n) {
    __n = local_370.size_;
  }
  if (__n != 0) {
    memmove(local_340,local_338,__n);
  }
  local_218[uStack_350] = '\0';
  pFVar1 = fopen(local_218,"w");
  this->ofs = (FILE *)pFVar1;
  return;
}

Assistant:

debug_logger(const std::string_view name) noexcept
    {
        if constexpr (debug) {
            char buffer[512] = { '\0' };

            auto written = fmt::format_to_n(
              buffer,
              511,
              "{}-{}.log",
              name,
              std::hash<std::thread::id>{}(std::this_thread::get_id()));

            buffer[written.size] = '\0';

            ofs = std::fopen(buffer, "w");
        } else {
            (void)name;

            ofs = nullptr;
        }
    }